

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

Var Js::Math::Ceil(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  ulong uVar8;
  CallInfo value;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int in_stack_00000010;
  undefined1 local_78 [8];
  ArgumentReader args;
  CallInfo local_50;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x156,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d40295;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_78 = (undefined1  [8])local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_78,&local_50);
  if (((ulong)local_78 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x157,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d40295;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x15a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d40295;
    *puVar6 = 0;
  }
  if (((ulong)local_78 & 0xfffffe) == 0) {
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nan.
           ptr;
  }
  pvVar7 = Arguments::operator[]((Arguments *)local_78,1);
  if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d40295;
    *puVar6 = 0;
  }
  if (((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
    return pvVar7;
  }
  if ((ulong)pvVar7 >> 0x32 == 0) {
    callInfo_local = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar7,pSVar1);
    uVar10 = extraout_XMM0_Qb;
  }
  else {
    callInfo_local = (CallInfo)((ulong)pvVar7 ^ 0xfffc000000000000);
    uVar10 = 0;
  }
  BVar4 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  if (BVar4 == 0) {
    auVar9 = roundsd(ZEXT816(0),callInfo_local,10);
    value = auVar9._0_8_;
    uVar8 = (ulong)(double)value;
    if (((long)(int)uVar8 == uVar8) &&
       (callInfo_local = value, bVar3 = NumberUtilities::IsSpecial((double)value,0x8000000000000000)
       , value = callInfo_local, !bVar3)) {
      uVar8 = uVar8 & 0xffffffff;
      goto LAB_00d40280;
    }
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = callInfo_local;
    auVar9 = roundsd(auVar9,auVar9,2);
    uVar5 = (uint)ROUND(auVar9._0_8_);
    if ((uVar5 & 0x7fffffff) != 0) {
      uVar8 = (ulong)uVar5;
LAB_00d40280:
      return (Var)(uVar8 | 0x1000000000000);
    }
    if ((uVar5 == 0) &&
       (unique0x10000467 = auVar9,
       bVar3 = NumberUtilities::IsSpecial(auVar9._0_8_,0x8000000000000000),
       auVar9 = stack0xffffffffffffff98, !bVar3)) {
      return &DAT_1000000000000;
    }
    auVar11._8_8_ = uVar10;
    auVar11._0_8_ = callInfo_local;
    auVar11 = roundsd(auVar11,auVar11,10);
    value = auVar9._0_8_;
    if (((double)value != auVar11._0_8_) || (NAN((double)value) || NAN(auVar11._0_8_))) {
      unique0x10000477 = auVar9;
      bVar3 = NumberUtilities::IsNan((double)value);
      value = (CallInfo)args.super_Arguments.Values;
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                    ,0x180,
                                    "(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult))"
                                    ,
                                    "dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult)"
                                   );
        if (!bVar3) {
LAB_00d40295:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        value = (CallInfo)args.super_Arguments.Values;
      }
    }
  }
  pvVar7 = JavascriptNumber::ToVarNoCheck((double)value,pSVar1);
  return pvVar7;
}

Assistant:

Var Math::Ceil(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 2)
        {
            Var inputArg = args[1];

            if (TaggedInt::Is(inputArg))
            {
                return inputArg;
            }

            double x = JavascriptConversion::ToNumber(inputArg, scriptContext);
#if defined(_M_ARM32_OR_ARM64)
            if (Js::JavascriptNumber::IsNan(x))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
#endif

#if (defined(_M_IX86) || defined(_M_X64)) \
    && (__SSE4_1__ || _WIN32) // _mm_ceil_sd needs this
            if (AutoSystemInfo::Data.SSE4_1Available())
            {
                __m128d input, output;
                input = _mm_load_sd(&x);
                output = _mm_ceil_sd(input, input);
                int intResult = _mm_cvtsd_si32(output);

                if (TaggedInt::IsOverflow(intResult) || intResult == 0 || intResult == 0x80000000)
                {
                    double dblResult;
                    _mm_store_sd(&dblResult, output);

                    if (intResult == 0 && !JavascriptNumber::IsNegZero(dblResult))
                    {
                        return JavascriptNumber::ToVar(0, scriptContext);
                    }

                    Assert(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult));

                    return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
            else
#endif
            {
                double result = ::ceil(x);

                intptr_t intResult = (intptr_t)result;

                if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(result))
                {
                    return JavascriptNumber::ToVarNoCheck(result, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }